

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_text_to_content_json.cpp
# Opt level: O2

string * sha256(string *__return_storage_ptr__,string *data)

{
  uchar local_38 [8];
  uint8_t digest [32];
  
  SHA256((uchar *)(data->_M_dataplus)._M_p,data->_M_string_length,local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38,digest + 0x18);
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(const std::string &data) {
  uint8_t digest[SHA256_DIGEST_LENGTH];
  SHA256(reinterpret_cast<const uint8_t *>(data.data()), data.size(), digest);
  return std::string{reinterpret_cast<const char *>(digest),
                     SHA256_DIGEST_LENGTH};
}